

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O1

TermList __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::derefQueryBinding
          (InstMatcher *this,uint var)

{
  DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  BindingMap *this_01;
  DerefTask *pDVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  Entry *pEVar4;
  undefined7 extraout_var;
  Entry *pEVar5;
  ulong uVar6;
  TermList TVar7;
  TermList **ppTVar8;
  VariableIterator *key;
  TermList tvar;
  TermSpec varBinding;
  TermList btv;
  TermList bvar;
  undefined1 local_b0 [8];
  TermSpec local_a8;
  TermList local_98;
  TermList **local_90;
  TermList **local_88;
  InstMatcher *local_80;
  undefined1 local_78 [16];
  size_t local_68;
  TermList **local_60;
  TermList **local_58;
  bool local_48;
  
  ppTVar8 = (TermList **)(ulong)(var * 4 + 1);
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
  local_a8.t._content = 2;
  this_00 = &this->_derefBindings;
  local_b0 = (undefined1  [8])ppTVar8;
  pEVar4 = ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
           findEntry(this_00,(TermList *)local_b0);
  if (pEVar4 == (Entry *)0x0) {
    pEVar5 = ::Lib::
             DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&this->_bindings,(TermList *)local_b0);
    if (pEVar5 != (Entry *)0x0) {
      local_a8._0_8_ = *(undefined8 *)&pEVar5->_val;
      local_a8.t._content = (pEVar5->_val).t._content;
    }
    bVar3 = TermSpec::isFinal(&local_a8);
    TVar7._content = CONCAT71(extraout_var,bVar3);
    if (bVar3) {
      ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                (this_00,(TermList)local_b0,local_a8.t);
      bVar3 = false;
      TVar7._content = local_a8.t._content;
    }
    else {
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
    TVar7._content = (uint64_t)(pEVar4->_val)._content;
  }
  if (!bVar3) {
    return (TermList)TVar7._content;
  }
  local_90 = ppTVar8;
  if (derefQueryBinding(unsigned_int)::toDo == '\0') {
    derefQueryBinding();
  }
  derefQueryBinding::toDo._cursor = derefQueryBinding::toDo._stack;
  this_01 = &this->_bindings;
  local_88 = (TermList **)&PTR__VariableIterator_00b697b8;
  local_80 = this;
  do {
    bVar3 = TermSpec::isFinal(&local_a8);
    if ((bVar3) || ((local_a8.t._content & 3) == 0)) {
      bVar3 = TermSpec::isFinal(&local_a8);
      TVar7._content = local_a8.t._content;
      auVar2 = local_b0;
      if (bVar3) {
        ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
        insert(this_00,(TermList)local_b0,local_a8.t);
      }
      else {
        bVar3 = local_a8.q;
        if (derefQueryBinding::toDo._cursor == derefQueryBinding::toDo._end) {
          ::Lib::Stack<Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::DerefTask>
          ::expand(&derefQueryBinding::toDo);
        }
        ((derefQueryBinding::toDo._cursor)->var)._content = (uint64_t)auVar2;
        ((derefQueryBinding::toDo._cursor)->trm).q = bVar3;
        ((derefQueryBinding::toDo._cursor)->trm).t._content = TVar7._content;
        derefQueryBinding::toDo._cursor = derefQueryBinding::toDo._cursor + 1;
        Kernel::VariableIterator::VariableIterator((VariableIterator *)local_78,local_a8.t);
        this = local_80;
        while (bVar3 = Kernel::VariableIterator::hasNext((VariableIterator *)local_78), bVar3) {
          local_48 = true;
          local_98._content = local_58[-1]->_content;
          if (((local_a8.q != false) || (((uint)local_98._content & 3) == 3)) &&
             (pEVar4 = ::Lib::
                       DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                       ::findEntry(this_00,&local_98), TVar7._content = local_98._content,
             pEVar4 == (Entry *)0x0)) {
            if (derefQueryBinding::toDo._cursor == derefQueryBinding::toDo._end) {
              ::Lib::
              Stack<Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::DerefTask>::
              expand(&derefQueryBinding::toDo);
            }
            ((derefQueryBinding::toDo._cursor)->var)._content = TVar7._content;
            ((derefQueryBinding::toDo._cursor)->trm).q = false;
            ((derefQueryBinding::toDo._cursor)->trm).t._content = 2;
            derefQueryBinding::toDo._cursor = derefQueryBinding::toDo._cursor + 1;
          }
        }
        local_78._0_8_ = local_88;
        if (local_60 != (TermList **)0x0) {
          uVar6 = local_68 * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar6 == 0) {
            *local_60 = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_60;
          }
          else if (uVar6 < 0x11) {
            *local_60 = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_60;
          }
          else if (uVar6 < 0x19) {
            *local_60 = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_60;
          }
          else if (uVar6 < 0x21) {
            *local_60 = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_60;
          }
          else if (uVar6 < 0x31) {
            *local_60 = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_60;
          }
          else if (uVar6 < 0x41) {
            *local_60 = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_60;
          }
          else {
            operator_delete(local_60,0x10);
          }
        }
      }
      while ((derefQueryBinding::toDo._cursor != derefQueryBinding::toDo._stack &&
             ((derefQueryBinding::toDo._cursor[-1].trm.t._content & 3) != 2))) {
        local_b0 = (undefined1  [8])derefQueryBinding::toDo._cursor[-1].var._content;
        pDVar1 = derefQueryBinding::toDo._cursor + -1;
        local_78._0_8_ =
             CONCAT71(local_78._1_7_,derefQueryBinding::toDo._cursor[-1].trm.q) & 0xffffffffffffff01
        ;
        derefQueryBinding::toDo._cursor = derefQueryBinding::toDo._cursor + -1;
        local_78._8_8_ = this;
        TVar7 = Kernel::SubstHelper::
                applyImpl<true,Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::DerefApplicator>
                          ((pDVar1->trm).t._content,(DerefApplicator *)local_78,false);
        ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
        insert(this_00,(TermList)local_b0,TVar7);
      }
      if (derefQueryBinding::toDo._cursor == derefQueryBinding::toDo._stack) {
        local_78._0_8_ = local_90;
        pEVar4 = ::Lib::
                 DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                 findEntry(this_00,(TermList *)local_78);
        return (TermList)(pEVar4->_val)._content;
      }
      local_b0 = (undefined1  [8])derefQueryBinding::toDo._cursor[-1].var._content;
      key = (VariableIterator *)local_b0;
      derefQueryBinding::toDo._cursor = derefQueryBinding::toDo._cursor + -1;
    }
    else {
      local_78._0_8_ = local_a8.t._content;
      pEVar4 = ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::findEntry(this_00,(TermList *)local_78);
      key = (VariableIterator *)local_78;
      if (pEVar4 != (Entry *)0x0) {
        ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
        insert(this_00,(TermList)local_b0,(TermList)(pEVar4->_val)._content);
      }
    }
    pEVar5 = ::Lib::
             DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(this_01,(TermList *)key);
    if (pEVar5 != (Entry *)0x0) {
      local_a8._0_8_ = *(undefined8 *)&pEVar5->_val;
      local_a8.t._content = (pEVar5->_val).t._content;
    }
  } while( true );
}

Assistant:

TermList SubstitutionTree<LeafData_>::InstMatcher::derefQueryBinding(unsigned var)
{
  TermList tvar0(var, false);
  TermList tvar=tvar0;

  TermSpec varBinding;
  {
    TermList val;
    if(_derefBindings.find(tvar, val)) {
      return val;
    }
    //only bound values can be passed to this function
    ALWAYS(_bindings.find(tvar, varBinding));

    if(varBinding.isFinal()) {
      ALWAYS(_derefBindings.insert(tvar, varBinding.t));
      return varBinding.t;
    }
  }
  static Stack<DerefTask> toDo;
  toDo.reset();

  for(;;) {
    while(!varBinding.isFinal() && !varBinding.t.isTerm()) {
      ASS(varBinding.t.isVar());
      ASS(!varBinding.q || !varBinding.t.isOrdinaryVar());


      TermList bvar=varBinding.t;
      TermList derefBoundTerm;

      if(_derefBindings.find(bvar, derefBoundTerm)) {
	ALWAYS(_derefBindings.insert(tvar, derefBoundTerm));
      }

      ALWAYS(_bindings.find(bvar,varBinding));
    }
    if(varBinding.isFinal()) {
      ALWAYS(_derefBindings.insert(tvar, varBinding.t));
      goto next_loop;
    }
    {
      ASS(varBinding.t.isTerm());
      toDo.push(DerefTask(tvar, varBinding));
      VariableIterator vit(varBinding.t);
      while(vit.hasNext()) {
	TermList btv=vit.next(); //bound term variable
	if(varBinding.q || btv.isSpecialVar()) {
	  ASS(_bindings.find(btv));
	  if(!_derefBindings.find(btv)) {
	    toDo.push(DerefTask(btv));
	  }
	}
      }
    }
    next_loop:
    while(toDo.isNonEmpty() && toDo.top().buildDerefTerm()) {
      tvar=toDo.top().var;
      TermSpec tspec=toDo.pop().trm;
      DerefApplicator applicator(this, tspec.q);
      TermList derefTerm=SubstHelper::applySV(tspec.t, applicator);
      ASS_REP(!derefTerm.isTerm() || derefTerm.term()->shared(), derefTerm);
      ALWAYS(_derefBindings.insert(tvar, derefTerm));
    }
    if(toDo.isEmpty()) {
      break;
    }
    tvar=toDo.pop().var;
    ALWAYS(_bindings.find(tvar, varBinding));
  };
  return _derefBindings.get(tvar0);
}